

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O2

bool __thiscall MinVR::element::set_comment(element *this,char *the_comment)

{
  allocator<char> local_39;
  string local_38;
  
  set_name(this,"Comment");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,the_comment,&local_39);
  set_value(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this->is_comment = true;
  return true;
}

Assistant:

bool element::set_comment(char* the_comment)
{
    set_name("Comment");
    set_value(the_comment);
    is_comment = true;
    return true;
}